

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Type> * __thiscall
wasm::IRBuilder::getLabelType
          (Result<wasm::Type> *__return_storage_ptr__,IRBuilder *this,Index label)

{
  Type TVar1;
  undefined1 local_88 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> scope;
  undefined1 local_40 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> _val;
  
  getScope((Result<wasm::IRBuilder::ScopeCtx_*> *)local_88,this,label);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_40,
                  (_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_88);
  if (_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20),
               (string *)local_40);
    std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_40);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_40);
    TVar1 = ScopeCtx::getLabelType((ScopeCtx *)local_88);
    *(uintptr_t *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = TVar1.id;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Result<Type> IRBuilder::getLabelType(Index label) {
  auto scope = getScope(label);
  CHECK_ERR(scope);
  return (*scope)->getLabelType();
}